

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::InstructionFolder::FoldVectors
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          InstructionFolder *this,Op opcode,uint32_t num_dims,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *operands)

{
  pointer ppCVar1;
  uint *__args;
  iterator __position;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  IRContext *this_00;
  undefined8 *puVar5;
  long lVar6;
  pointer ppCVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operand_values_for_one_dimension;
  uint local_6c;
  undefined1 local_68 [8];
  __uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  _Stack_60;
  __uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  local_58;
  Op local_44;
  ulong local_40;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *local_38;
  
  this_00 = (IRContext *)__return_storage_ptr__;
  local_44 = opcode;
  local_38 = operands;
  bVar2 = IsFoldableOpcode((InstructionFolder *)__return_storage_ptr__,opcode);
  if (!bVar2) {
    __assert_fail("IsFoldableOpcode(opcode) && \"Unhandled instruction opcode in FoldVectors\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0x1e0,
                  "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (num_dims != 0) {
    local_40 = (ulong)num_dims;
    uVar8 = 0;
    do {
      local_68 = (undefined1  [8])0x0;
      _Stack_60._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
      .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
           (tuple<spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
            )(_Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
              )0x0;
      local_58._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
      .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
           (tuple<spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>)
           (_Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
            )0x0;
      ppCVar1 = (local_38->
                super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar7 = (local_38->
                     super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppCVar7 != ppCVar1;
          ppCVar7 = ppCVar7 + 1) {
        iVar3 = (*(*ppCVar7)->_vptr_Constant[0x13])();
        plVar4 = (long *)CONCAT44(extraout_var,iVar3);
        if (plVar4 == (long *)0x0) {
          this_00 = (IRContext *)*ppCVar7;
          lVar6 = (*(code *)(((IRContext *)this_00->syntax_context_)->id_to_func_)._M_h.
                            _M_bucket_count)();
          if (lVar6 == 0) {
            __assert_fail("false && \"FoldVectors() only accepts VectorConst or NullConst type of \" \"constant\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                          ,0x201,
                          "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                         );
          }
LAB_005a7888:
          local_6c = 0;
          if (_Stack_60._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
              .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl ==
              (tuple<spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
               )local_58._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl) {
            this_00 = (IRContext *)local_68;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                       (iterator)
                       _Stack_60._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                       .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>.
                       _M_head_impl,&local_6c);
          }
          else {
            *(uint *)_Stack_60._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                     .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>.
                     _M_head_impl = 0;
LAB_005a78a2:
            _Stack_60._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
            .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
                 (tuple<spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                  )((long)_Stack_60._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                          .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>.
                          _M_head_impl + 4);
          }
        }
        else {
          plVar4 = (long *)(**(code **)(*plVar4 + 0xc0))(plVar4);
          if ((ulong)(plVar4[1] - *plVar4 >> 3) <= uVar8) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
          }
          this_00 = (IRContext *)(**(code **)(**(long **)(*plVar4 + uVar8 * 8) + 0x68))();
          if (this_00 == (IRContext *)0x0) {
            this_00 = (IRContext *)*ppCVar7;
            lVar6 = (*(code *)(((IRContext *)this_00->syntax_context_)->id_to_func_)._M_h.
                              _M_bucket_count)();
            if (lVar6 == 0) {
              __assert_fail("false && \"VectorConst should only has ScalarConst or NullConst as \" \"components\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                            ,0x1fa,
                            "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                           );
            }
            goto LAB_005a7888;
          }
          puVar5 = (undefined8 *)
                   (*(code *)(((IRContext *)this_00->syntax_context_)->id_to_func_)._M_h.
                             _M_element_count)();
          __args = (uint *)*puVar5;
          if (puVar5[1] - (long)__args != 4) {
            __assert_fail("scalar_words.size() == 1 && \"Vector components with longer than 32-bit width are not allowed \" \"in FoldVectors()\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                          ,499,
                          "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                         );
          }
          if (_Stack_60._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
              .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl !=
              (tuple<spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
               )local_58._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl) {
            *(uint *)_Stack_60._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                     .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>.
                     _M_head_impl = *__args;
            goto LAB_005a78a2;
          }
          this_00 = (IRContext *)local_68;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_68,
                     (iterator)
                     _Stack_60._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                     .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>.
                     _M_head_impl,__args);
        }
      }
      local_6c = OperateWords((InstructionFolder *)this_00,local_44,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (__return_storage_ptr__,__position,&local_6c);
      }
      else {
        *__position._M_current = local_6c;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (local_68 != (undefined1  [8])0x0) {
        operator_delete((void *)local_68,
                        (long)local_58._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                              .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>.
                              _M_head_impl - (long)local_68);
      }
      uVar8 = uVar8 + 1;
      this_00 = (IRContext *)local_68;
    } while (uVar8 != local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> InstructionFolder::FoldVectors(
    spv::Op opcode, uint32_t num_dims,
    const std::vector<const analysis::Constant*>& operands) const {
  assert(IsFoldableOpcode(opcode) &&
         "Unhandled instruction opcode in FoldVectors");
  std::vector<uint32_t> result;
  for (uint32_t d = 0; d < num_dims; d++) {
    std::vector<uint32_t> operand_values_for_one_dimension;
    for (const auto& operand : operands) {
      if (const analysis::VectorConstant* vector_operand =
              operand->AsVectorConstant()) {
        // Extract the raw value of the scalar component constants
        // in 32-bit words here. The reason of not using FoldScalars() here
        // is that we do not create temporary null constants as components
        // when the vector operand is a NullConstant because Constant creation
        // may need extra checks for the validity and that is not managed in
        // here.
        if (const analysis::ScalarConstant* scalar_component =
                vector_operand->GetComponents().at(d)->AsScalarConstant()) {
          const auto& scalar_words = scalar_component->words();
          assert(
              scalar_words.size() == 1 &&
              "Vector components with longer than 32-bit width are not allowed "
              "in FoldVectors()");
          operand_values_for_one_dimension.push_back(scalar_words.front());
        } else if (operand->AsNullConstant()) {
          operand_values_for_one_dimension.push_back(0u);
        } else {
          assert(false &&
                 "VectorConst should only has ScalarConst or NullConst as "
                 "components");
        }
      } else if (operand->AsNullConstant()) {
        operand_values_for_one_dimension.push_back(0u);
      } else {
        assert(false &&
               "FoldVectors() only accepts VectorConst or NullConst type of "
               "constant");
      }
    }
    result.push_back(OperateWords(opcode, operand_values_for_one_dimension));
  }
  return result;
}